

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O3

void __thiscall
pbrt::ImageTextureBase::ImageTextureBase
          (ImageTextureBase *this,TextureMapping2DHandle *mapping,string *filename,
          MIPMapFilterOptions filterOptions,WrapMode wrapMode,Float scale,bool invert,
          ColorEncodingHandle *encoding,Allocator alloc)

{
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding> TVar1;
  pointer pcVar2;
  mapped_type pMVar3;
  iterator iVar4;
  MIPMap *pMVar5;
  mapped_type *ppMVar6;
  unique_lock<std::mutex> local_88;
  MIPMapFilterOptions local_78;
  key_type local_70;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_38;
  
  (this->mapping).
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  .bits = 0;
  (this->mapping).
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  .bits = (mapping->
          super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
          ).bits;
  this->scale = scale;
  this->invert = invert;
  TVar1.bits = (encoding->
               super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               ).bits;
  local_70.filename._M_dataplus._M_p = (pointer)&local_70.filename.field_2;
  pcVar2 = (filename->_M_dataplus)._M_p;
  local_78 = filterOptions;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + filename->_M_string_length);
  local_88._M_device = (mutex_type *)textureCacheMutex;
  local_88._M_owns = false;
  local_70.filterOptions = filterOptions;
  local_70.wrapMode = wrapMode;
  local_70.encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            )TVar1.bits;
  std::unique_lock<std::mutex>::lock(&local_88);
  local_88._M_owns = true;
  iVar4 = std::
          _Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>_>_>
          ::find((_Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>_>_>
                  *)textureCache,&local_70);
  if (iVar4._M_node == (_Base_ptr)(textureCache + 8)) {
    std::unique_lock<std::mutex>::unlock(&local_88);
    local_38.bits =
         (encoding->
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         ).bits;
    pMVar5 = MIPMap::CreateFromFile
                       (filename,&local_78,wrapMode,(ColorEncodingHandle *)&local_38,alloc);
    this->mipmap = pMVar5;
    std::unique_lock<std::mutex>::lock(&local_88);
    iVar4 = std::
            _Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>_>_>
            ::find((_Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>_>_>
                    *)textureCache,&local_70);
    if (iVar4._M_node != (_Base_ptr)(textureCache + 8)) {
      LogFatal<char_const(&)[49]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/textures.h"
                 ,0x223,"Check failed: %s",
                 (char (*) [49])"textureCache.find(texInfo) == textureCache.end()");
    }
    pMVar3 = this->mipmap;
    ppMVar6 = std::
              map<pbrt::TexInfo,_pbrt::MIPMap_*,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>_>_>
              ::operator[]((map<pbrt::TexInfo,_pbrt::MIPMap_*,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>_>_>
                            *)textureCache,&local_70);
    *ppMVar6 = pMVar3;
  }
  else {
    this->mipmap = (MIPMap *)iVar4._M_node[2]._M_right;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.filename._M_dataplus._M_p != &local_70.filename.field_2) {
    operator_delete(local_70.filename._M_dataplus._M_p,
                    local_70.filename.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ImageTextureBase(TextureMapping2DHandle mapping, std::string filename,
                     MIPMapFilterOptions filterOptions, WrapMode wrapMode, Float scale,
                     bool invert, ColorEncodingHandle encoding, Allocator alloc)
        : mapping(mapping), scale(scale), invert(invert) {
        // Get _MIPMap_ from texture cache if present
        TexInfo texInfo(filename, filterOptions, wrapMode, encoding);
        std::unique_lock<std::mutex> lock(textureCacheMutex);
        if (auto iter = textureCache.find(texInfo); iter != textureCache.end()) {
            mipmap = iter->second;
            return;
        }
        lock.unlock();

        // Create _MIPMap_ for _filename_ and add to texture cache
        mipmap =
            MIPMap::CreateFromFile(filename, filterOptions, wrapMode, encoding, alloc);
        lock.lock();
        // This is actually ok, but if it hits, it means we've wastefully
        // loaded this texture. (Note that in that case, should just return
        // the one that's already in there and not replace it.)
        CHECK(textureCache.find(texInfo) == textureCache.end());
        textureCache[texInfo] = mipmap;
    }